

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>::
write(arg_formatter_base<duckdb_fmt::v6::buffer_range<wchar_t>,_duckdb_fmt::v6::internal::error_handler>
      *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  uint uVar2;
  format_specs *specs;
  buffer<wchar_t> *pbVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  size_t extraout_RAX;
  undefined4 extraout_var;
  void *pvVar8;
  InternalException *this_00;
  wchar_t *data;
  undefined4 in_register_00000034;
  wchar_t *__s;
  string local_50;
  size_t sVar7;
  
  __s = (wchar_t *)CONCAT44(in_register_00000034,__fd);
  if (__s == (wchar_t *)0x0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"string pointer is null","")
    ;
    duckdb::InternalException::InternalException(this_00,&local_50);
    __cxa_throw(this_00,&duckdb::InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar6 = wcslen(__s);
  specs = this->specs_;
  if (specs == (format_specs *)0x0) {
    pbVar3 = (this->writer_).out_.container;
    sVar4 = pbVar3->size_;
    uVar1 = sVar4 + sVar6;
    sVar7 = sVar6;
    if (pbVar3->capacity_ < uVar1) {
      iVar5 = (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
      sVar7 = CONCAT44(extraout_var,iVar5);
    }
    pbVar3->size_ = uVar1;
    if (sVar6 != 0) {
      pvVar8 = memmove(pbVar3->ptr_ + sVar4,__s,sVar6 << 2);
      return (ssize_t)pvVar8;
    }
  }
  else {
    uVar2 = specs->precision;
    local_50._M_string_length = (ulong)uVar2;
    if (sVar6 <= uVar2) {
      local_50._M_string_length = sVar6;
    }
    if ((int)uVar2 < 0) {
      local_50._M_string_length = sVar6;
    }
    local_50._M_dataplus._M_p = (pointer)__s;
    basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
    write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::str_writer<wchar_t>>
              ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this,specs,
               (str_writer<wchar_t> *)&local_50);
    sVar7 = extraout_RAX;
  }
  return sVar7;
}

Assistant:

void write(const char_type* value) {
    if (!value) {
      FMT_THROW(duckdb::InternalException("string pointer is null"));
    } else {
      auto length = std::char_traits<char_type>::length(value);
      basic_string_view<char_type> sv(value, length);
      specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
    }
  }